

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O3

void __thiscall DPolyobjInterpolation::Serialize(DPolyobjInterpolation *this,FSerializer *arc)

{
  uint *puVar1;
  uint uVar2;
  FSerializer *pFVar3;
  uint amount;
  
  DInterpolation::Serialize(&this->super_DInterpolation,arc);
  pFVar3 = Serialize<FPolyObj>(arc,"poly",&this->poly,(FPolyObj **)0x0);
  pFVar3 = Serialize<double,double>(pFVar3,"oldverts",&this->oldverts,(TArray<double,_double> *)0x0)
  ;
  pFVar3 = ::Serialize(pFVar3,"oldcx",&this->oldcx,(double *)0x0);
  ::Serialize(pFVar3,"oldcy",&this->oldcy,(double *)0x0);
  if (arc->r != (FReader *)0x0) {
    uVar2 = (this->oldverts).Count;
    puVar1 = &(this->bakverts).Count;
    amount = uVar2 - *puVar1;
    if (*puVar1 <= uVar2 && amount != 0) {
      TArray<double,_double>::Grow(&this->bakverts,amount);
    }
    (this->bakverts).Count = uVar2;
  }
  return;
}

Assistant:

void DPolyobjInterpolation::Serialize(FSerializer &arc)
{
	Super::Serialize(arc);
	arc("poly", poly)
		("oldverts", oldverts)
		("oldcx", oldcx)
		("oldcy", oldcy);
	if (arc.isReading()) bakverts.Resize(oldverts.Size());
}